

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

void free_descriptor_address_item(wally_descriptor_address_item *item,size_t item_len)

{
  wally_descriptor_address_item *dest;
  size_t sVar1;
  
  dest = item;
  sVar1 = item_len;
  if (item == (wally_descriptor_address_item *)0x0) {
    return;
  }
  while (sVar1 != 0) {
    if (dest->address != (char *)0x0) {
      wally_clear(dest->address,dest->address_len);
      wally_free(dest->address);
    }
    wally_clear(dest,0x18);
    dest = dest + 1;
    sVar1 = sVar1 - 1;
  }
  wally_clear(item,item_len * 0x18);
  wally_free(item);
  return;
}

Assistant:

static void free_descriptor_address_item(
    struct wally_descriptor_address_item *item, size_t item_len)
{
    size_t index;
    if (item) {
        for (index = 0; index < item_len; ++index) {
            if (item[index].address) {
                wally_clear((void *)item[index].address, item[index].address_len);
                wally_free((void *)item[index].address);
            }
            wally_clear((void *)&item[index], sizeof(item[index]));
        }
        wally_clear((void *)item, item_len * sizeof(struct wally_descriptor_address_item));
        wally_free((void *)item);
    }
}